

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O0

void __thiscall icu_63::double_conversion::Bignum::AssignUInt64(Bignum *this,uint64_t value)

{
  uint *puVar1;
  int local_24;
  int i;
  int needed_bigits;
  int kUInt64Size;
  uint64_t value_local;
  Bignum *this_local;
  
  Zero(this);
  if (value != 0) {
    EnsureCapacity(this,3);
    _needed_bigits = value;
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      puVar1 = Vector<unsigned_int>::operator[](&this->bigits_,local_24);
      *puVar1 = (uint)_needed_bigits & 0xfffffff;
      _needed_bigits = _needed_bigits >> 0x1c;
    }
    this->used_digits_ = 3;
    Clamp(this);
  }
  return;
}

Assistant:

void Bignum::AssignUInt64(uint64_t value) {
  const int kUInt64Size = 64;

  Zero();
  if (value == 0) return;

  int needed_bigits = kUInt64Size / kBigitSize + 1;
  EnsureCapacity(needed_bigits);
  for (int i = 0; i < needed_bigits; ++i) {
    bigits_[i] = value & kBigitMask;
    value = value >> kBigitSize;
  }
  used_digits_ = needed_bigits;
  Clamp();
}